

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O3

void __thiscall
tchecker::par_expression_t::par_expression_t
          (par_expression_t *this,shared_ptr<const_tchecker::expression_t> *expr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  invalid_argument *this_00;
  
  *(undefined ***)this = &PTR__par_expression_t_002805f8;
  peVar2 = (expr->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (this->_expr).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  p_Var1 = (expr->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_expr).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->_expr).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (peVar2 != (element_type *)0x0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"nullptr sub expression");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

par_expression_t::par_expression_t(std::shared_ptr<tchecker::expression_t const> const & expr) : _expr(expr)
{
  if (_expr.get() == nullptr)
    throw std::invalid_argument("nullptr sub expression");
}